

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_5b5eb::OpenXrProgram::CreateSwapchains(OpenXrProgram *this)

{
  int32_t iVar1;
  int32_t iVar2;
  element_type *peVar3;
  long lVar4;
  pointer pXVar5;
  XrResult XVar6;
  int iVar7;
  undefined4 extraout_var;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  pointer plVar11;
  long lVar12;
  long local_2e8;
  uint32_t imageCount;
  uint32_t swapchainFormatCount;
  string swapchainFormatsString;
  uint32_t viewCount;
  vector<long,_std::allocator<long>_> swapchainFormats;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_258;
  value_type local_248;
  vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
  swapchainImages;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  XrSystemProperties systemProperties;
  
  if (this->m_session == (XrSession)0x0) {
    std::__cxx11::string::string((string *)&local_180,"Check failed",(allocator *)&systemProperties)
    ;
    Throw(&local_180,"m_session != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:576"
         );
  }
  if ((this->m_swapchains).super__Vector_base<Swapchain,_std::allocator<Swapchain>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_swapchains).super__Vector_base<Swapchain,_std::allocator<Swapchain>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_1a0,"Check failed",(allocator *)&systemProperties)
    ;
    Throw(&local_1a0,"m_swapchains.empty()",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:577"
         );
  }
  if ((this->m_configViews).
      super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_configViews).
      super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_1c0,"Check failed",(allocator *)&systemProperties)
    ;
    Throw(&local_1c0,"m_configViews.empty()",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:578"
         );
  }
  memset(&systemProperties,0,0x130);
  systemProperties.type = XR_TYPE_SYSTEM_PROPERTIES;
  XVar6 = xrGetSystemProperties(this->m_instance,this->m_systemId,&systemProperties);
  CheckXrResult(XVar6,"xrGetSystemProperties(m_instance, m_systemId, &systemProperties)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:582"
               );
  Fmt_abi_cxx11_(&swapchainFormatsString,"System Properties: Name=%s VendorId=%d",
                 systemProperties.systemName,(ulong)systemProperties.vendorId);
  Log::Write(Info,&swapchainFormatsString);
  std::__cxx11::string::~string((string *)&swapchainFormatsString);
  Fmt_abi_cxx11_(&swapchainFormatsString,
                 "System Graphics Properties: MaxWidth=%d MaxHeight=%d MaxLayers=%d",
                 (ulong)systemProperties.graphicsProperties.maxSwapchainImageWidth,
                 (ulong)systemProperties.graphicsProperties.maxSwapchainImageHeight,
                 (ulong)systemProperties.graphicsProperties.maxLayerCount);
  Log::Write(Info,&swapchainFormatsString);
  std::__cxx11::string::~string((string *)&swapchainFormatsString);
  pcVar8 = "False";
  pcVar9 = "False";
  if (systemProperties.trackingProperties.orientationTracking == 1) {
    pcVar9 = "True";
  }
  if (systemProperties.trackingProperties.positionTracking == 1) {
    pcVar8 = "True";
  }
  Fmt_abi_cxx11_(&swapchainFormatsString,
                 "System Tracking Properties: OrientationTracking=%s PositionTracking=%s",pcVar9,
                 pcVar8);
  Log::Write(Info,&swapchainFormatsString);
  std::__cxx11::string::~string((string *)&swapchainFormatsString);
  if ((((this->m_options).super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      Parsed).ViewConfigType == XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO) {
    XVar6 = xrEnumerateViewConfigurationViews(this->m_instance,this->m_systemId,2,0,&viewCount,0);
    CheckXrResult(XVar6,
                  "xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &viewCount, nullptr)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:604"
                 );
    swapchainFormatsString._M_string_length = 0;
    swapchainFormatsString.field_2._M_allocated_capacity = 0;
    swapchainFormatsString.field_2._8_8_ = 0;
    swapchainFormatsString._M_dataplus._M_p = (pointer)0x29;
    std::vector<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>::resize
              (&this->m_configViews,(ulong)viewCount,(value_type *)&swapchainFormatsString);
    XVar6 = xrEnumerateViewConfigurationViews
                      (this->m_instance,this->m_systemId,
                       (((this->m_options).
                         super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       Parsed).ViewConfigType,viewCount,&viewCount,
                       (this->m_configViews).
                       super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    CheckXrResult(XVar6,
                  "xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, viewCount, &viewCount, m_configViews.data())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:607"
                 );
    swapchainFormatsString._M_string_length = 0;
    swapchainFormatsString.field_2._M_allocated_capacity = 0;
    swapchainFormatsString.field_2._8_8_ = 0;
    swapchainFormatsString._M_dataplus._M_p = (pointer)0x7;
    std::vector<XrView,_std::allocator<XrView>_>::resize
              (&this->m_views,(ulong)viewCount,(value_type *)&swapchainFormatsString);
    if (viewCount != 0) {
      XVar6 = xrEnumerateSwapchainFormats(this->m_session,0,&swapchainFormatCount,0);
      CheckXrResult(XVar6,
                    "xrEnumerateSwapchainFormats(m_session, 0, &swapchainFormatCount, nullptr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:616"
                   );
      std::vector<long,_std::allocator<long>_>::vector
                (&swapchainFormats,(ulong)swapchainFormatCount,
                 (allocator_type *)&swapchainFormatsString);
      XVar6 = xrEnumerateSwapchainFormats
                        (this->m_session,
                         (ulong)((long)swapchainFormats.
                                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)swapchainFormats.
                                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 3,&swapchainFormatCount);
      CheckXrResult(XVar6,
                    "xrEnumerateSwapchainFormats(m_session, (uint32_t)swapchainFormats.size(), &swapchainFormatCount, swapchainFormats.data())"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:619"
                   );
      if ((long)swapchainFormats.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)swapchainFormats.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (ulong)swapchainFormatCount) {
        std::__cxx11::string::string
                  ((string *)&local_200,"Check failed",(allocator *)&swapchainFormatsString);
        Throw(&local_200,"swapchainFormatCount == swapchainFormats.size()",
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:620"
             );
      }
      peVar3 = (this->m_graphicsPlugin).
               super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar7 = (*peVar3->_vptr_IGraphicsPlugin[4])(peVar3,&swapchainFormats);
      this->m_colorSwapchainFormat = CONCAT44(extraout_var,iVar7);
      swapchainFormatsString._M_dataplus._M_p = (pointer)&swapchainFormatsString.field_2;
      swapchainFormatsString._M_string_length = 0;
      swapchainFormatsString.field_2._M_allocated_capacity =
           swapchainFormatsString.field_2._M_allocated_capacity & 0xffffffffffffff00;
      for (plVar11 = swapchainFormats.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
          plVar11 !=
          swapchainFormats.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish; plVar11 = plVar11 + 1) {
        lVar12 = *plVar11;
        lVar4 = this->m_colorSwapchainFormat;
        std::__cxx11::string::append((char *)&swapchainFormatsString);
        if (lVar12 == lVar4) {
          std::__cxx11::string::append((char *)&swapchainFormatsString);
        }
        std::__cxx11::to_string((string *)local_268,lVar12);
        std::__cxx11::string::append((string *)&swapchainFormatsString);
        std::__cxx11::string::~string((string *)local_268);
        if (lVar12 == lVar4) {
          std::__cxx11::string::append((char *)&swapchainFormatsString);
        }
      }
      Fmt_abi_cxx11_((string *)local_268,"Swapchain Formats: %s",
                     swapchainFormatsString._M_dataplus._M_p);
      Log::Write(Verbose,(string *)local_268);
      std::__cxx11::string::~string((string *)local_268);
      std::__cxx11::string::~string((string *)&swapchainFormatsString);
      local_2e8 = 0;
      for (uVar10 = 0; uVar10 < viewCount; uVar10 = uVar10 + 1) {
        pXVar5 = (this->m_configViews).
                 super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        Fmt_abi_cxx11_(&swapchainFormatsString,
                       "Creating swapchain for view %d with dimensions Width=%d Height=%d SampleCount=%d"
                       ,uVar10,(ulong)*(uint *)((long)&pXVar5->recommendedImageRectWidth + local_2e8
                                               ),
                       (ulong)*(uint *)((long)&pXVar5->recommendedImageRectHeight + local_2e8),
                       (ulong)*(uint *)((long)&pXVar5->recommendedSwapchainSampleCount + local_2e8))
        ;
        Log::Write(Info,&swapchainFormatsString);
        lVar12 = (long)&pXVar5->type + local_2e8;
        std::__cxx11::string::~string((string *)&swapchainFormatsString);
        swapchainFormatsString._M_string_length = 0;
        swapchainFormatsString.field_2._M_allocated_capacity = 0;
        swapchainFormatsString.field_2._8_8_ = 0;
        swapchainFormatsString._M_dataplus._M_p = (pointer)0x9;
        iVar1 = *(int32_t *)(lVar12 + 0x10);
        iVar2 = *(int32_t *)(lVar12 + 0x18);
        peVar3 = (this->m_graphicsPlugin).
                 super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar3->_vptr_IGraphicsPlugin[8])(peVar3,lVar12);
        swapchainFormatsString.field_2._8_8_ = 0x21;
        local_248.height = iVar2;
        local_248.width = iVar1;
        XVar6 = xrCreateSwapchain(this->m_session,&swapchainFormatsString,&local_248);
        CheckXrResult(XVar6,"xrCreateSwapchain(m_session, &swapchainCreateInfo, &swapchain.handle)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:660"
                     );
        std::vector<Swapchain,_std::allocator<Swapchain>_>::push_back
                  (&this->m_swapchains,&local_248);
        XVar6 = xrEnumerateSwapchainImages(local_248.handle,0,&imageCount,0);
        CheckXrResult(XVar6,"xrEnumerateSwapchainImages(swapchain.handle, 0, &imageCount, nullptr)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:665"
                     );
        peVar3 = (this->m_graphicsPlugin).
                 super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar3->_vptr_IGraphicsPlugin[6])
                  (&swapchainImages.
                    super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                   ,peVar3,(ulong)imageCount,&swapchainFormatsString);
        XVar6 = xrEnumerateSwapchainImages
                          (local_248.handle,imageCount,&imageCount,
                           *swapchainImages.
                            super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        CheckXrResult(XVar6,
                      "xrEnumerateSwapchainImages(swapchain.handle, imageCount, &imageCount, swapchainImages[0])"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:669"
                     );
        local_268._0_8_ = local_248.handle;
        local_268._8_8_ =
             swapchainImages.
             super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
        aStack_258._M_allocated_capacity =
             (size_type)
             swapchainImages.
             super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        aStack_258._8_8_ =
             swapchainImages.
             super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        swapchainImages.
        super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        swapchainImages.
        super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        swapchainImages.
        super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        _Rb_tree<XrSwapchain_T*,std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>,std::_Select1st<std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>,std::less<XrSwapchain_T*>,std::allocator<std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>>
        ::
        _M_emplace_unique<std::pair<XrSwapchain_T*,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>
                  ((_Rb_tree<XrSwapchain_T*,std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>,std::_Select1st<std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>,std::less<XrSwapchain_T*>,std::allocator<std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>>
                    *)&this->m_swapchainImages,
                   (pair<XrSwapchain_T_*,_std::vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>_>
                    *)local_268);
        std::
        _Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>::
        ~_Vector_base((_Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                       *)(local_268 + 8));
        std::
        _Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>::
        ~_Vector_base(&swapchainImages.
                       super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                     );
        local_2e8 = local_2e8 + 0x28;
      }
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&swapchainFormats.super__Vector_base<long,_std::allocator<long>_>);
    }
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_1e0,"Unsupported view configuration type",
             (allocator *)&swapchainFormatsString);
  Throw(&local_1e0,"m_options->Parsed.ViewConfigType == XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO",
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:599"
       );
}

Assistant:

void CreateSwapchains() override {
        CHECK(m_session != XR_NULL_HANDLE);
        CHECK(m_swapchains.empty());
        CHECK(m_configViews.empty());

        // Read graphics properties for preferred swapchain length and logging.
        XrSystemProperties systemProperties{XR_TYPE_SYSTEM_PROPERTIES};
        CHECK_XRCMD(xrGetSystemProperties(m_instance, m_systemId, &systemProperties));

        // Log system properties.
        Log::Write(Log::Level::Info,
                   Fmt("System Properties: Name=%s VendorId=%d", systemProperties.systemName, systemProperties.vendorId));
        Log::Write(Log::Level::Info, Fmt("System Graphics Properties: MaxWidth=%d MaxHeight=%d MaxLayers=%d",
                                         systemProperties.graphicsProperties.maxSwapchainImageWidth,
                                         systemProperties.graphicsProperties.maxSwapchainImageHeight,
                                         systemProperties.graphicsProperties.maxLayerCount));
        Log::Write(Log::Level::Info, Fmt("System Tracking Properties: OrientationTracking=%s PositionTracking=%s",
                                         systemProperties.trackingProperties.orientationTracking == XR_TRUE ? "True" : "False",
                                         systemProperties.trackingProperties.positionTracking == XR_TRUE ? "True" : "False"));

        // Note: No other view configurations exist at the time this code was written. If this
        // condition is not met, the project will need to be audited to see how support should be
        // added.
        CHECK_MSG(m_options->Parsed.ViewConfigType == XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO,
                  "Unsupported view configuration type");

        // Query and cache view configuration views.
        uint32_t viewCount;
        CHECK_XRCMD(
            xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &viewCount, nullptr));
        m_configViews.resize(viewCount, {XR_TYPE_VIEW_CONFIGURATION_VIEW});
        CHECK_XRCMD(xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, viewCount,
                                                      &viewCount, m_configViews.data()));

        // Create and cache view buffer for xrLocateViews later.
        m_views.resize(viewCount, {XR_TYPE_VIEW});

        // Create the swapchain and get the images.
        if (viewCount > 0) {
            // Select a swapchain format.
            uint32_t swapchainFormatCount;
            CHECK_XRCMD(xrEnumerateSwapchainFormats(m_session, 0, &swapchainFormatCount, nullptr));
            std::vector<int64_t> swapchainFormats(swapchainFormatCount);
            CHECK_XRCMD(xrEnumerateSwapchainFormats(m_session, (uint32_t)swapchainFormats.size(), &swapchainFormatCount,
                                                    swapchainFormats.data()));
            CHECK(swapchainFormatCount == swapchainFormats.size());
            m_colorSwapchainFormat = m_graphicsPlugin->SelectColorSwapchainFormat(swapchainFormats);

            // Print swapchain formats and the selected one.
            {
                std::string swapchainFormatsString;
                for (int64_t format : swapchainFormats) {
                    const bool selected = format == m_colorSwapchainFormat;
                    swapchainFormatsString += " ";
                    if (selected) {
                        swapchainFormatsString += "[";
                    }
                    swapchainFormatsString += std::to_string(format);
                    if (selected) {
                        swapchainFormatsString += "]";
                    }
                }
                Log::Write(Log::Level::Verbose, Fmt("Swapchain Formats: %s", swapchainFormatsString.c_str()));
            }

            // Create a swapchain for each view.
            for (uint32_t i = 0; i < viewCount; i++) {
                const XrViewConfigurationView& vp = m_configViews[i];
                Log::Write(Log::Level::Info,
                           Fmt("Creating swapchain for view %d with dimensions Width=%d Height=%d SampleCount=%d", i,
                               vp.recommendedImageRectWidth, vp.recommendedImageRectHeight, vp.recommendedSwapchainSampleCount));

                // Create the swapchain.
                XrSwapchainCreateInfo swapchainCreateInfo{XR_TYPE_SWAPCHAIN_CREATE_INFO};
                swapchainCreateInfo.arraySize = 1;
                swapchainCreateInfo.format = m_colorSwapchainFormat;
                swapchainCreateInfo.width = vp.recommendedImageRectWidth;
                swapchainCreateInfo.height = vp.recommendedImageRectHeight;
                swapchainCreateInfo.mipCount = 1;
                swapchainCreateInfo.faceCount = 1;
                swapchainCreateInfo.sampleCount = m_graphicsPlugin->GetSupportedSwapchainSampleCount(vp);
                swapchainCreateInfo.usageFlags = XR_SWAPCHAIN_USAGE_SAMPLED_BIT | XR_SWAPCHAIN_USAGE_COLOR_ATTACHMENT_BIT;
                Swapchain swapchain;
                swapchain.width = swapchainCreateInfo.width;
                swapchain.height = swapchainCreateInfo.height;
                CHECK_XRCMD(xrCreateSwapchain(m_session, &swapchainCreateInfo, &swapchain.handle));

                m_swapchains.push_back(swapchain);

                uint32_t imageCount;
                CHECK_XRCMD(xrEnumerateSwapchainImages(swapchain.handle, 0, &imageCount, nullptr));
                // XXX This should really just return XrSwapchainImageBaseHeader*
                std::vector<XrSwapchainImageBaseHeader*> swapchainImages =
                    m_graphicsPlugin->AllocateSwapchainImageStructs(imageCount, swapchainCreateInfo);
                CHECK_XRCMD(xrEnumerateSwapchainImages(swapchain.handle, imageCount, &imageCount, swapchainImages[0]));

                m_swapchainImages.insert(std::make_pair(swapchain.handle, std::move(swapchainImages)));
            }
        }
    }